

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcRun(void)

{
  nullres nVar1;
  int iVar2;
  TraceScope traceScope;
  TraceScope TStack_18;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    nVar1 = '\0';
  }
  else {
    if (nullcRun::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcRun::token);
      if (iVar2 != 0) {
        nullcRun::token = NULLC::TraceGetToken("nullc","nullcRun");
        __cxa_guard_release(&nullcRun::token);
      }
    }
    NULLC::TraceScope::TraceScope(&TStack_18,nullcRun::token);
    nVar1 = nullcRunFunction((char *)0x0);
    NULLC::TraceScope::~TraceScope(&TStack_18);
  }
  return nVar1;
}

Assistant:

nullres	nullcRun()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcRun");

#ifndef NULLC_NO_EXECUTOR
	return nullcRunFunction(NULL);
#else
	nullcLastError = "No executor available, compile library without NULLC_NO_EXECUTOR";
	return false;
#endif
}